

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O1

Mesh * vera::lineMesh(Mesh *__return_storage_ptr__,vec3 *_a,vec3 *_b)

{
  vec3 local_28;
  undefined8 local_1c;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_14;
  
  local_28.field_0 = _a->field_0;
  local_28.field_1 = _a->field_1;
  local_28.field_2 = _a->field_2;
  local_1c._0_4_ = _b->field_0;
  local_1c._4_4_ = _b->field_1;
  local_14 = _b->field_2;
  Mesh::Mesh(__return_storage_ptr__);
  Mesh::addVertices(__return_storage_ptr__,&local_28,2);
  __return_storage_ptr__->m_drawMode = LINES;
  return __return_storage_ptr__;
}

Assistant:

Mesh lineMesh(const glm::vec3 &_a, const glm::vec3 &_b) {
    glm::vec3 linePoints[2];
    linePoints[0] = glm::vec3(_a.x,_a.y,_a.z);
    linePoints[1] = glm::vec3(_b.x,_b.y,_b.z);;

    Mesh mesh;
    mesh.addVertices(linePoints,2);
    mesh.setDrawMode(LINES);
    return mesh;
}